

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::append(QString *this,QUtf8StringView str)

{
  char16_t *pcVar1;
  storage_type *psVar2;
  DataPointer *d;
  storage_type *psVar3;
  const_pointer strData;
  QByteArrayView in;
  
  pcVar1 = (char16_t *)str.m_size;
  psVar3 = str.m_data;
  if ((long)pcVar1 < 1 || psVar3 == (storage_type *)0x0) {
    if ((psVar3 != (storage_type *)0x0) && ((this->d).ptr == (char16_t *)0x0)) {
      operator=(this,(QLatin1StringView)ZEXT816(0x13a233));
    }
  }
  else {
    psVar2 = (storage_type *)0x0;
    QArrayDataPointer<char16_t>::detachAndGrow
              (&this->d,GrowsAtEnd,(qsizetype)pcVar1,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    in.m_data = psVar2;
    in.m_size = (qsizetype)psVar3;
    pcVar1 = QUtf8::convertToUnicode((QUtf8 *)((this->d).ptr + (this->d).size),pcVar1,in);
    resize(this,(long)pcVar1 - (long)(this->d).ptr >> 1);
  }
  return this;
}

Assistant:

QString &QString::append(QUtf8StringView str)
{
    append_helper(*this, str);
    return *this;
}